

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SetColorEditOptions(ImGuiColorEditFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint in_EDI;
  ImGuiContext *g;
  uint local_4;
  
  pIVar1 = GImGui;
  local_4 = in_EDI;
  if ((in_EDI & 0x700000) == 0) {
    local_4 = in_EDI | 0x100000;
  }
  if ((local_4 & 0x1800000) == 0) {
    local_4 = local_4 | 0x800000;
  }
  if ((local_4 & 0x6000000) == 0) {
    local_4 = local_4 | 0x2000000;
  }
  if ((local_4 & 0x18000000) == 0) {
    local_4 = local_4 | 0x8000000;
  }
  bVar2 = ImIsPowerOfTwo(local_4 & 0x700000);
  if (!bVar2) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x13e2,"SetColorEditOptions","ImGui ASSERT FAILED: %s",
                "ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DisplayMask)");
  }
  bVar2 = ImIsPowerOfTwo(local_4 & 0x1800000);
  if (!bVar2) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x13e3,"SetColorEditOptions","ImGui ASSERT FAILED: %s",
                "ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DataTypeMask)");
  }
  bVar2 = ImIsPowerOfTwo(local_4 & 0x6000000);
  if (!bVar2) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x13e4,"SetColorEditOptions","ImGui ASSERT FAILED: %s",
                "ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)");
  }
  bVar2 = ImIsPowerOfTwo(local_4 & 0x18000000);
  if (!bVar2) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x13e5,"SetColorEditOptions","ImGui ASSERT FAILED: %s",
                "ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)");
  }
  pIVar1->ColorEditOptions = local_4;
  return;
}

Assistant:

void ImGui::SetColorEditOptions(ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;
    if ((flags & ImGuiColorEditFlags__DisplayMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__DisplayMask;
    if ((flags & ImGuiColorEditFlags__DataTypeMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__DataTypeMask;
    if ((flags & ImGuiColorEditFlags__PickerMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__PickerMask;
    if ((flags & ImGuiColorEditFlags__InputMask) == 0)
        flags |= ImGuiColorEditFlags__OptionsDefault & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DisplayMask));    // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__DataTypeMask));   // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask));     // Check only 1 option is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));      // Check only 1 option is selected
    g.ColorEditOptions = flags;
}